

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O1

bool __thiscall
BlurayHelper::writeBluRayFiles
          (BlurayHelper *this,MuxerManager *muxer,bool usedBlankPL,int mplsNum,int blankNum,
          bool stereoMode)

{
  AbstractMuxer *__last;
  byte bVar1;
  byte bVar2;
  DiskType DVar3;
  pointer pcVar4;
  void *pvVar5;
  AbstractMuxer *pAVar6;
  long *plVar7;
  File *pFVar8;
  MuxerManager *pMVar9;
  bool bVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  ushort val;
  int iVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  _func_int **pp_Var17;
  MuxerManager *this_00;
  long lVar18;
  byte bVar19;
  char cVar20;
  long lVar21;
  AbstractMuxer *__first;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  *navCmds;
  undefined8 uVar22;
  initializer_list<std::array<unsigned_char,_12UL>_> __l;
  initializer_list<std::array<unsigned_char,_12UL>_> __l_00;
  initializer_list<std::array<unsigned_char,_12UL>_> __l_01;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SubTrackMode mode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> objectData;
  vector<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
  movieObjects;
  array<unsigned_char,_4UL> type_indicator;
  array<unsigned_char,_4UL> version_number;
  uint16_t local_1ea;
  File *local_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  allocator_type local_1b9;
  array<unsigned_char,_12UL> local_1b8;
  undefined4 uStack_1ac;
  long local_1a8 [10];
  MuxerManager *apMStack_158 [3];
  SubTrackMode local_140;
  SubTrackMode local_13c;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_138;
  undefined2 local_120;
  undefined1 local_11e [6];
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_118;
  undefined2 local_100;
  undefined1 local_fe;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_f8;
  undefined2 local_e0;
  undefined1 local_de;
  vector<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
  local_d8;
  MuxerManager *local_c0;
  undefined1 local_b4 [16];
  undefined8 local_a4;
  ulong local_9c;
  undefined4 local_94;
  ulong local_90;
  undefined4 local_88;
  undefined2 local_84;
  undefined8 local_82;
  undefined2 local_7a;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  local_1e0 = local_1d0;
  apMStack_158[2] = muxer;
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    pcVar4 = (this->m_dstPath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar4,pcVar4 + (this->m_dstPath)._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  }
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    local_1e8 = (File *)operator_new(0x38);
    File::File(local_1e8);
  }
  else {
    local_1e8 = (File *)IsoWriter::createFile(this->m_isoWriter);
  }
  if (this->m_dt == BLURAY) {
    bVar10 = isV3();
    if (bVar10) {
      bdIndexData[5] = '3';
      bdIndexData[0xf] = 'x';
      bdIndexData[0x78] = '\0';
      bdIndexData[0x79] = '\0';
      bdIndexData[0x7a] = '\0';
      bdIndexData[0x7b] = ' ';
      bdIndexData[0x7c] = '\0';
      bdIndexData[0x7d] = '\0';
      bdIndexData[0x7e] = '\0';
      bdIndexData[0x7f] = '\x18';
      bdIndexData[0x80] = '\0';
      bdIndexData[0x81] = '\0';
      bdIndexData[0x82] = '\0';
      bdIndexData[0x83] = '\x01';
      bdIndexData[0x84] = '\0';
      bdIndexData[0x85] = '\x03';
      bdIndexData[0x86] = '\0';
      bdIndexData[0x87] = '\x01';
      bdIndexData[0x88] = '\0';
      bdIndexData[0x89] = '\0';
      bdIndexData[0x8a] = '\0';
      bdIndexData[0x8b] = '\x18';
      bdIndexData[0x8c] = '\0';
      bdIndexData[0x8d] = '\0';
      bdIndexData[0x8e] = '\0';
      bdIndexData[0x8f] = '\f';
      bdIndexData[0x90] = '\0';
      bdIndexData[0x91] = '\0';
      bdIndexData[0x92] = '\0';
      bdIndexData[0x93] = '\b';
      bdIndexData[0x94] = ' ';
      bdIndexData[0x95] = '\0';
      bdIndexData[0x96] = '\0';
      bdIndexData[0x97] = '\0';
      bdIndexData[0x98] = '\0';
      bdIndexData[0x99] = '\0';
      bdIndexData[0x9a] = '\0';
      bdIndexData[0x9b] = '\0';
      bVar10 = is4K();
      if (bVar10) {
        bdIndexData[0x94] = 'Q';
      }
      bVar19 = 1;
      if ((V3_flags & 0x1eU) != 0) {
        bVar19 = (byte)V3_flags & 0x1e;
      }
      bdIndexData[0x96] = bVar19;
      uVar22 = 0x9c;
    }
    else {
      bdIndexData[5] = '2';
      uVar22 = 0x78;
    }
  }
  else {
    bdIndexData[5] = '1';
    bdIndexData[0xf] = 'x';
    uVar22 = 0x210;
  }
  bdIndexData[0x2c] = '`';
  if (!stereoMode) {
    bdIndexData[0x2c] = '\0';
  }
  local_1b8._M_elems[0] = (uchar)local_1a8;
  local_1b8._M_elems[1] = (uchar)((ulong)local_1a8 >> 8);
  local_1b8._M_elems._2_2_ = SUB82((ulong)local_1a8 >> 0x10,0);
  local_1b8._M_elems[4] = (uchar)((ulong)local_1a8 >> 0x20);
  local_1b8._M_elems[5] = (uchar)((ulong)local_1a8 >> 0x28);
  local_1b8._M_elems[6] = (uchar)((ulong)local_1a8 >> 0x30);
  local_1b8._M_elems[7] = (uchar)((ulong)local_1a8 >> 0x38);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_1e0,local_1d8 + (long)local_1e0);
  std::__cxx11::string::append((char *)&local_1b8);
  iVar13 = (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                     (local_1e8,
                      CONCAT17(local_1b8._M_elems[7],
                               CONCAT16(local_1b8._M_elems[6],
                                        CONCAT15(local_1b8._M_elems[5],
                                                 CONCAT14(local_1b8._M_elems[4],
                                                          CONCAT22(local_1b8._M_elems._2_2_,
                                                                   CONCAT11(local_1b8._M_elems[1],
                                                                            local_1b8._M_elems[0])))
                                                ))),2);
  plVar7 = (long *)CONCAT17(local_1b8._M_elems[7],
                            CONCAT16(local_1b8._M_elems[6],
                                     CONCAT15(local_1b8._M_elems[5],
                                              CONCAT14(local_1b8._M_elems[4],
                                                       CONCAT22(local_1b8._M_elems._2_2_,
                                                                CONCAT11(local_1b8._M_elems[1],
                                                                         local_1b8._M_elems[0]))))))
  ;
  if (plVar7 != local_1a8) {
    operator_delete(plVar7,local_1a8[0] + 1);
  }
  pp_Var17 = (local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream;
  if ((char)iVar13 != '\0') {
    (*pp_Var17[5])(local_1e8,bdIndexData,uVar22);
    (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])();
    local_1b8._M_elems[0] = (uchar)local_1a8;
    local_1b8._M_elems[1] = (uchar)((ulong)local_1a8 >> 8);
    local_1b8._M_elems._2_2_ = SUB82((ulong)local_1a8 >> 0x10,0);
    local_1b8._M_elems[4] = (uchar)((ulong)local_1a8 >> 0x20);
    local_1b8._M_elems[5] = (uchar)((ulong)local_1a8 >> 0x28);
    local_1b8._M_elems[6] = (uchar)((ulong)local_1a8 >> 0x30);
    local_1b8._M_elems[7] = (uchar)((ulong)local_1a8 >> 0x38);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_1e0,local_1d8 + (long)local_1e0);
    std::__cxx11::string::append((char *)&local_1b8);
    iVar13 = (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                       (local_1e8,
                        CONCAT17(local_1b8._M_elems[7],
                                 CONCAT16(local_1b8._M_elems[6],
                                          CONCAT15(local_1b8._M_elems[5],
                                                   CONCAT14(local_1b8._M_elems[4],
                                                            CONCAT22(local_1b8._M_elems._2_2_,
                                                                     CONCAT11(local_1b8._M_elems[1],
                                                                              local_1b8._M_elems[0])
                                                                    ))))),2);
    plVar7 = (long *)CONCAT17(local_1b8._M_elems[7],
                              CONCAT16(local_1b8._M_elems[6],
                                       CONCAT15(local_1b8._M_elems[5],
                                                CONCAT14(local_1b8._M_elems[4],
                                                         CONCAT22(local_1b8._M_elems._2_2_,
                                                                  CONCAT11(local_1b8._M_elems[1],
                                                                           local_1b8._M_elems[0]))))
                                      ));
    if (plVar7 != local_1a8) {
      operator_delete(plVar7,local_1a8[0] + 1);
    }
    pp_Var17 = (local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream;
    if ((char)iVar13 != '\0') {
      (*pp_Var17[5])(local_1e8,bdIndexData,uVar22);
      (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])();
      DVar3 = this->m_dt;
      local_b4[0] = 'P';
      local_b4[1] = '\0';
      local_b4[2] = '\0';
      local_b4[3] = '\x01';
      local_b4[4] = '\0';
      local_b4[5] = '\0';
      local_b4[6] = '\0';
      local_b4[7] = '\n';
      local_b4._8_8_ = 0x100405000000000;
      local_a4 = 0;
      if (usedBlankPL) {
        uVar14 = my_ntohl(blankNum);
        local_9c = (ulong)uVar14 << 0x20 | 0x8242;
        local_94 = 0xa000000;
      }
      else {
        local_94 = 0;
        local_9c = 0x1004050;
      }
      uVar14 = my_ntohl(mplsNum);
      local_90 = (ulong)uVar14 << 0x20 | 0x8242;
      local_88 = 0xa000000;
      local_84 = 0x200;
      local_82 = 0;
      local_7a = 0;
      __l._M_len = 5;
      __l._M_array = (iterator)local_b4;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector(&local_138,__l,(allocator_type *)&local_140);
      local_120 = 1;
      local_11e[0] = 0;
      memcpy(&local_1b8,&DAT_00206a04,0x6c);
      __l_00._M_len = 9;
      __l_00._M_array = &local_1b8;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
              *)(local_11e + 6),__l_00,(allocator_type *)&local_1ea);
      local_100 = 1;
      local_fe = 0;
      uStack_48 = 0x8121;
      uStack_44 = 0;
      uStack_58 = 0x1004050ffff0000;
      uStack_50 = 0x4000000;
      local_4c = 0;
      local_68 = 0x100000002000000;
      uStack_60 = 0x300000001004050;
      local_78[0] = 'P';
      local_78[1] = '@';
      local_78[2] = '\0';
      local_78[3] = '\x01';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78._8_8_ = 0x100405000000000;
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)local_78;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector(&local_f8,__l_01,&local_1b9);
      local_e0 = 1;
      local_de = 0;
      local_d8.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (MuxerManager *)operator_new(0x60);
      local_d8.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this_00->field_0x60;
      uVar12 = 0;
      lVar21 = 0;
      local_d8.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      do {
        lVar18 = lVar21;
        std::
        vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
        vector((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                *)((long)&(((_Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                             *)&this_00->m_mainMuxer)->_M_impl).super__Vector_impl_data._M_start +
                  lVar18),
               (vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                *)((long)&local_138.
                          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18));
        pMVar9 = apMStack_158[2];
        *(undefined1 *)((long)&(this_00->m_outFileName)._M_dataplus._M_p + lVar18 + 2) =
             local_11e[lVar18];
        *(undefined2 *)((long)&(this_00->m_outFileName)._M_dataplus._M_p + lVar18) =
             *(undefined2 *)(local_11e + lVar18 + -2);
        uVar12 = uVar12 + 1;
        lVar21 = lVar18 + 0x20;
      } while (lVar18 + 0x20 != 0x60);
      local_d8.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&this_00->field_0x60;
      local_c0 = (MuxerManager *)&this_00->field_0x40;
      lVar21 = 0x60;
      do {
        pvVar5 = *(void **)((long)apMStack_158 + lVar21);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)apMStack_158 + lVar21 + 0x10) - (long)pvVar5);
        }
        lVar21 = lVar21 + -0x20;
      } while (lVar21 != 0);
      cVar20 = '\0';
      if (DVar3 == BLURAY) {
        bVar10 = isV3();
        cVar20 = bVar10 + '\x01';
      }
      uVar15 = MuxerManager::getDefaultAudioTrackIdx(pMVar9);
      uVar16 = MuxerManager::getDefaultSubTrackIdx(pMVar9,&local_140);
      if ((uVar16 & uVar15) != 0xffffffff) {
        apMStack_158[2] =
             (MuxerManager *)
             (((_Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                *)&this_00->m_mainMuxer)->_M_impl).super__Vector_impl_data._M_start;
        local_13c = local_140;
        local_1b8._M_elems[8] = '\0';
        local_1b8._M_elems[9] = '\0';
        local_1b8._M_elems[10] = '\0';
        local_1b8._M_elems[0xb] = '\0';
        local_1b8._M_elems[0] = 'Q';
        local_1b8._M_elems[1] = 0xc0;
        local_1b8._M_elems[2] = '\0';
        local_1b8._M_elems[3] = '\x01';
        local_1b8._M_elems[4] = 0;
        local_1b8._M_elems[5] = '\0';
        local_1b8._M_elems[6] = '\0';
        local_1b8._M_elems[7] = '\0';
        if (-1 < (int)uVar15) {
          uVar11 = my_ntohs((short)uVar15 + 1);
          local_1b8._M_elems[5] = (uchar)(uVar11 >> 8);
          local_1b8._M_elems[4] = (byte)uVar11 & 0xf | 0x80;
        }
        local_1b8._M_elems[7] = '\0';
        local_1b8._M_elems[6] = 0;
        if (-1 < (int)uVar16) {
          uVar11 = my_ntohs((short)uVar16 + 1);
          local_1b8._M_elems[7] = (uchar)(uVar11 >> 8);
          local_1b8._M_elems[8] = '\0';
          local_1b8._M_elems[9] = '\0';
          local_1b8._M_elems[6] = (byte)uVar11 & 0xf | 0x80;
        }
        if (local_13c == All) {
          local_1b8._M_elems[6] = local_1b8._M_elems[6] | 0x40;
        }
        local_138.
        super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT17(local_1b8._M_elems[7],
                               CONCAT16(local_1b8._M_elems[6],
                                        CONCAT15(local_1b8._M_elems[5],
                                                 CONCAT14(local_1b8._M_elems[4],
                                                          CONCAT22(local_1b8._M_elems._2_2_,
                                                                   CONCAT11(local_1b8._M_elems[1],
                                                                            local_1b8._M_elems[0])))
                                                )));
        local_138.
        super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_138.
                               super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               CONCAT22(local_1b8._M_elems._10_2_,local_1b8._M_elems._8_2_));
        std::
        vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
        _M_insert_rval((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                        *)this_00,(const_iterator)&apMStack_158[2]->m_outFileName,
                       (value_type *)&local_138);
      }
      local_b4._0_4_ = 0x4a424f4d;
      uVar15 = 0x30303230;
      if (cVar20 != '\x01') {
        uVar15 = (uint)(cVar20 == '\x02') << 9 | 0x30303130;
      }
      local_78._0_4_ = uVar15;
      local_138.
      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.
      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.
      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar15 = 6;
      lVar21 = -0x20;
      do {
        uVar15 = uVar15 + (((uint)(*(int *)((long)&(this_00->m_outFileName).field_2 + lVar21) -
                                  *(int *)((long)&(this_00->m_outFileName)._M_string_length + lVar21
                                          )) >> 2) * -0x55555555 & 0xffff) * 0xc + 4;
        lVar21 = lVar21 + 0x20;
      } while (lVar18 != lVar21);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
                 (ulong)uVar15 + 0x2c);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_b4,local_b4 + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_78,local_78 + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      uVar14 = my_ntohl(0);
      local_1b8._M_elems[0] = (uchar)uVar14;
      local_1b8._M_elems[1] = (uchar)(uVar14 >> 8);
      local_1b8._M_elems._2_2_ = SUB42(uVar14 >> 0x10,0);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1b8._M_elems,local_1b8._M_elems + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      local_1b8._M_elems[0] = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
                 (long)local_138.
                       super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (0x1c - (long)local_138.
                               super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start),local_1b8._M_elems);
      uVar14 = my_ntohl(uVar15);
      local_1b8._M_elems[0] = (uchar)uVar14;
      local_1b8._M_elems[1] = (uchar)(uVar14 >> 8);
      local_1b8._M_elems._2_2_ = SUB42(uVar14 >> 0x10,0);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1b8._M_elems,local_1b8._M_elems + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      uVar14 = my_ntohl(0);
      local_1b8._M_elems[0] = (uchar)uVar14;
      local_1b8._M_elems[1] = (uchar)(uVar14 >> 8);
      local_1b8._M_elems._2_2_ = SUB42(uVar14 >> 0x10,0);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1b8._M_elems,local_1b8._M_elems + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      uVar12 = my_ntohs(uVar12);
      local_1b8._M_elems[0] = (uchar)uVar12;
      local_1b8._M_elems[1] = (uchar)(uVar12 >> 8);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1b8._M_elems,local_1b8._M_elems + 2,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      do {
        bVar19 = *(byte *)&(this_00->m_outFileName)._M_dataplus._M_p;
        bVar1 = *(byte *)((long)&(this_00->m_outFileName)._M_dataplus._M_p + 1);
        bVar2 = *(byte *)((long)&(this_00->m_outFileName)._M_dataplus._M_p + 2);
        val = (short)((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)&this_00->m_subMuxer)->_M_allocated_capacity -
                      (long)(((_Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                               *)&this_00->m_mainMuxer)->_M_impl).super__Vector_impl_data._M_start
                     >> 2) * -0x5555;
        local_1b8._M_elems[0] = '\0';
        local_1b8._M_elems[1] = '\0';
        local_1b8._M_elems[2] = '\0';
        local_1b8._M_elems[3] = '\0';
        local_1b8._M_elems[4] = '\0';
        local_1b8._M_elems[5] = '\0';
        local_1b8._M_elems[6] = '\0';
        local_1b8._M_elems[7] = '\0';
        local_1b8._M_elems[8] = '\0';
        local_1b8._M_elems[9] = '\0';
        local_1b8._M_elems[10] = '\0';
        local_1b8._M_elems[0xb] = '\0';
        uStack_1ac = 0;
        local_1a8[0] = 0;
        apMStack_158[2] = this_00;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8,
                   (ulong)val * 0xc + 4);
        local_1ea = my_ntohs((ushort)bVar2 << 0xd | (ushort)bVar1 << 0xe | (ushort)bVar19 << 0xf);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)&local_1ea,(uchar *)&local_1e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8);
        local_1ea = my_ntohs(val);
        pMVar9 = apMStack_158[2];
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)&local_1ea,(uchar *)&local_1e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8);
        pAVar6 = pMVar9->m_subMuxer;
        __first = (AbstractMuxer *)
                  (((_Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                     *)&pMVar9->m_mainMuxer)->_M_impl).super__Vector_impl_data._M_start;
        while (__first != pAVar6) {
          __last = (AbstractMuxer *)((long)&__first->m_owner + 4);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((uchar *)__first,(uchar *)__last,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8);
          __first = __last;
        }
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)CONCAT17(local_1b8._M_elems[7],
                                     CONCAT16(local_1b8._M_elems[6],
                                              CONCAT15(local_1b8._M_elems[5],
                                                       CONCAT14(local_1b8._M_elems[4],
                                                                CONCAT22(local_1b8._M_elems._2_2_,
                                                                         CONCAT11(local_1b8._M_elems
                                                                                  [1],local_1b8.
                                                                                      _M_elems[0])))
                                                      ))),
                   (uchar *)CONCAT44(uStack_1ac,
                                     CONCAT22(local_1b8._M_elems._10_2_,local_1b8._M_elems._8_2_)),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
        pvVar5 = (void *)CONCAT17(local_1b8._M_elems[7],
                                  CONCAT16(local_1b8._M_elems[6],
                                           CONCAT15(local_1b8._M_elems[5],
                                                    CONCAT14(local_1b8._M_elems[4],
                                                             CONCAT22(local_1b8._M_elems._2_2_,
                                                                      CONCAT11(local_1b8._M_elems[1]
                                                                               ,local_1b8._M_elems
                                                                                [0]))))));
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,local_1a8[0] - (long)pvVar5);
        }
        this_00 = (MuxerManager *)&(pMVar9->m_outFileName)._M_string_length;
      } while (local_c0 != pMVar9);
      local_1b8._M_elems[0] = (uchar)local_1a8;
      local_1b8._M_elems[1] = (uchar)((ulong)local_1a8 >> 8);
      local_1b8._M_elems._2_2_ = SUB82((ulong)local_1a8 >> 0x10,0);
      local_1b8._M_elems[4] = (uchar)((ulong)local_1a8 >> 0x20);
      local_1b8._M_elems[5] = (uchar)((ulong)local_1a8 >> 0x28);
      local_1b8._M_elems[6] = (uchar)((ulong)local_1a8 >> 0x30);
      local_1b8._M_elems[7] = (uchar)((ulong)local_1a8 >> 0x38);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_1e0,local_1d8 + (long)local_1e0);
      std::__cxx11::string::append((char *)&local_1b8);
      pFVar8 = local_1e8;
      iVar13 = (*(local_1e8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream
                 [2])(local_1e8,
                      CONCAT17(local_1b8._M_elems[7],
                               CONCAT16(local_1b8._M_elems[6],
                                        CONCAT15(local_1b8._M_elems[5],
                                                 CONCAT14(local_1b8._M_elems[4],
                                                          CONCAT22(local_1b8._M_elems._2_2_,
                                                                   CONCAT11(local_1b8._M_elems[1],
                                                                            local_1b8._M_elems[0])))
                                                ))),2,0);
      plVar7 = (long *)CONCAT17(local_1b8._M_elems[7],
                                CONCAT16(local_1b8._M_elems[6],
                                         CONCAT15(local_1b8._M_elems[5],
                                                  CONCAT14(local_1b8._M_elems[4],
                                                           CONCAT22(local_1b8._M_elems._2_2_,
                                                                    CONCAT11(local_1b8._M_elems[1],
                                                                             local_1b8._M_elems[0]))
                                                          ))));
      if (plVar7 != local_1a8) {
        operator_delete(plVar7,local_1a8[0] + 1);
      }
      if ((char)iVar13 == '\0') {
LAB_001792fd:
        bVar10 = false;
      }
      else {
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                  (pFVar8,local_138.
                          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                   (ulong)(uint)((int)local_138.
                                      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)local_138.
                                     super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])(pFVar8)
        ;
        local_1b8._M_elems[0] = (uchar)local_1a8;
        local_1b8._M_elems[1] = (uchar)((ulong)local_1a8 >> 8);
        local_1b8._M_elems._2_2_ = SUB82((ulong)local_1a8 >> 0x10,0);
        local_1b8._M_elems[4] = (uchar)((ulong)local_1a8 >> 0x20);
        local_1b8._M_elems[5] = (uchar)((ulong)local_1a8 >> 0x28);
        local_1b8._M_elems[6] = (uchar)((ulong)local_1a8 >> 0x30);
        local_1b8._M_elems[7] = (uchar)((ulong)local_1a8 >> 0x38);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_1e0,local_1d8 + (long)local_1e0);
        std::__cxx11::string::append((char *)&local_1b8);
        iVar13 = (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2]
                 )(pFVar8,CONCAT17(local_1b8._M_elems[7],
                                   CONCAT16(local_1b8._M_elems[6],
                                            CONCAT15(local_1b8._M_elems[5],
                                                     CONCAT14(local_1b8._M_elems[4],
                                                              CONCAT22(local_1b8._M_elems._2_2_,
                                                                       CONCAT11(local_1b8._M_elems
                                                                                [1],local_1b8.
                                                                                    _M_elems[0])))))
                                  ),2,0);
        plVar7 = (long *)CONCAT17(local_1b8._M_elems[7],
                                  CONCAT16(local_1b8._M_elems[6],
                                           CONCAT15(local_1b8._M_elems[5],
                                                    CONCAT14(local_1b8._M_elems[4],
                                                             CONCAT22(local_1b8._M_elems._2_2_,
                                                                      CONCAT11(local_1b8._M_elems[1]
                                                                               ,local_1b8._M_elems
                                                                                [0]))))));
        if (plVar7 != local_1a8) {
          operator_delete(plVar7,local_1a8[0] + 1);
        }
        if ((char)iVar13 == '\0') goto LAB_001792fd;
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                  (pFVar8,local_138.
                          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                   (ulong)(uint)((int)local_138.
                                      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)local_138.
                                     super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        bVar10 = true;
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])(pFVar8)
        ;
      }
      (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[1])(pFVar8);
      if (local_138.
          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.
                        super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ::~vector(&local_d8);
      goto LAB_00179332;
    }
  }
  (*pp_Var17[1])();
  bVar10 = false;
LAB_00179332:
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  return bVar10;
}

Assistant:

bool BlurayHelper::writeBluRayFiles(const MuxerManager& muxer, const bool usedBlankPL, const int mplsNum,
                                    const int blankNum, const bool stereoMode) const
{
    int fileSize = sizeof(bdIndexData);
    const string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    if (m_dt == DiskType::BLURAY)
    {
        if (isV3())
        {
            bdIndexData[5] = '3';
            fileSize = 0x9C;         // add 36 bytes for UHD data extension
            bdIndexData[15] = 0x78;  // start address of UHD data extension

            // UHD data extension
            uint8_t* V3metaData = bdIndexData + 0x78;
            static constexpr char metaData[37] =
                "\x00\x00\x00\x20\x00\x00\x00\x18\x00\x00\x00\x01"
                "\x00\x03\x00\x01\x00\x00\x00\x18\x00\x00\x00\x0C"
                "\x00\x00\x00\x08\x20\x00\x00\x00\x00\x00\x00\x00";
            for (int i = 0; i < 36; i++) V3metaData[i] = metaData[i];

            // 4K => 66/100 GB Disk, 109 MB/s Recording_Rate
            if (is4K())
                bdIndexData[0x94] = 0x51;
            // include HDR flags
            bdIndexData[0x96] = (V3_flags & 0x1e);
            // no HDR10 detected => SDR flag
            if (bdIndexData[0x96] == 0)
                bdIndexData[0x96] = 1;
        }
        else  // V2 Blu-ray
        {
            bdIndexData[5] = '2';
            fileSize = 0x78;
        }
    }
    else
    {
        bdIndexData[5] = '1';
        bdIndexData[15] = 0x78;
    }
    bdIndexData[0x2c] = stereoMode ? 0x60 : 0;  // set initial_output_mode_preference and SS_content_exist_flag

    if (!file->open((prefix + "BDMV/index.bdmv").c_str(), AbstractOutputStream::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    if (!file->open((prefix + "BDMV/BACKUP/index.bdmv").c_str(), File::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    return writeBdMovieObjectData(muxer, file, prefix, m_dt, usedBlankPL, mplsNum, blankNum);
}